

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O1

int dosearch0(int aflag)

{
  char cVar1;
  level *plVar2;
  boolean bVar3;
  char x;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  obj *poVar10;
  trap *trap;
  uint uVar11;
  long lVar12;
  int iVar13;
  char *pcVar14;
  int iVar15;
  monst *pmVar16;
  byte y;
  int local_78;
  int local_70;
  ulong local_68;
  byte local_44;
  
  if ((u._1052_1_ & 1) == 0) {
    local_70 = 0;
    if (((uwep != (obj *)0x0) && (uwep->oartifact != '\0')) &&
       (bVar3 = spec_ability(uwep,0x200), bVar3 != '\0')) {
      local_70 = (int)uwep->spe;
    }
    if (((ublindf != (obj *)0x0) && (ublindf->otyp == 0xed)) &&
       (((u.uprops[0x1e].intrinsic == 0 && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
        (ublindf->oartifact == '\x1d')))) {
      local_70 = local_70 + 2;
    }
    uVar11 = (int)u.ux - 1;
    local_68 = (ulong)uVar11;
    local_78 = (int)(char)uVar11;
    if (local_78 < u.ux + 2) {
      iVar8 = 5;
      if (local_70 < 5) {
        iVar8 = local_70;
      }
      uVar11 = 7 - iVar8;
      do {
        iVar13 = (int)u.uy;
        iVar15 = (int)(char)(u.uy + -1);
        x = (char)local_68;
        if (iVar15 < iVar13 + 2) {
          local_44 = x - 1;
          local_68 = local_68 & 0xff;
          iVar4 = iVar13;
          do {
            y = (byte)(iVar13 - 1U);
            if ((0x14 < y || 0x4e < local_44) || ((y == (byte)iVar4 && (x == u.ux))))
            goto LAB_00162a49;
            if ((u.uprops[0x1e].intrinsic != 0) ||
               (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
              if (ublindf == (obj *)0x0) {
                if (aflag == 0) goto LAB_00162ac0;
              }
              else if ((aflag == 0) && (ublindf->oartifact != '\x1d')) {
LAB_00162ac0:
                feel_location(x,y);
              }
            }
            uVar5 = iVar13 - 1U & 0xff;
            cVar1 = level->locations[local_68][uVar5].typ;
            if (cVar1 == '\x10') {
              uVar6 = mt_random();
              uVar6 = uVar6 % uVar11;
              lVar12 = (long)u.uluck;
              lVar9 = (long)u.moreluck;
              if (((int)(lVar9 + lVar12) != 0) &&
                 (uVar7 = mt_random(),
                 SUB168(ZEXT416(uVar7) % SEXT816(0x32 - (lVar9 + lVar12)),0) != 0)) {
                if ((local_70 < -8) || ((int)u.moreluck + (int)u.uluck < -5)) {
                  iVar4 = (int)u.moreluck + (int)u.uluck;
                }
                else {
                  iVar4 = ((int)u.moreluck + (int)u.uluck) / 3;
                }
                uVar6 = uVar6 - iVar4;
                if ((int)uVar6 < 0) {
                  uVar6 = 0;
                }
                else if ((int)uVar11 <= (int)uVar6) {
                  uVar6 = 6U - iVar8;
                }
              }
              if (uVar6 == 0) {
                level->locations[local_68][uVar5].typ = '\x18';
                unblock_point(local_78,iVar15);
                exercise(2,'\x01');
                nomul(0,(char *)0x0);
                newsym(local_78,iVar15);
                if (flags.verbose != '\0') {
                  pcVar14 = "You find a secret passage.";
                  goto LAB_00162ebd;
                }
              }
            }
            else {
              if (cVar1 != '\x0f') {
                pmVar16 = level->monsters[local_68][uVar5];
                if (pmVar16 == (monst *)0x0) {
                  pmVar16 = (monst *)0x0;
                }
                else if ((pmVar16->field_0x61 & 2) != 0) {
                  pmVar16 = (monst *)0x0;
                }
                if ((aflag != 0) || (pmVar16 == (monst *)0x0)) {
LAB_001633b8:
                  if (((aflag == 0) && (pmVar16 == (monst *)0x0)) &&
                     ((((u.uprops[0x1e].intrinsic == 0 &&
                        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                      ((level->locations[local_68][uVar5].field_0x6 & 8) != 0)))) {
                    unmap_object(local_78,iVar15);
                    newsym(local_78,iVar15);
                  }
                  trap = t_at(level,local_78,iVar15);
                  if ((trap != (trap *)0x0) && ((trap->field_0x8 & 0x20) == 0)) {
                    uVar5 = mt_random();
                    uVar5 = uVar5 & 7;
                    lVar12 = (long)u.uluck;
                    lVar9 = (long)u.moreluck;
                    if (((int)(lVar9 + lVar12) != 0) &&
                       (uVar6 = mt_random(),
                       SUB168(ZEXT416(uVar6) % SEXT816(0x32 - (lVar9 + lVar12)),0) != 0)) {
                      iVar4 = (int)u.moreluck + (int)u.uluck;
                      iVar15 = iVar4 / 3;
                      if (iVar4 < -5) {
                        iVar15 = iVar4;
                      }
                      uVar5 = uVar5 - iVar15;
                      if ((int)uVar5 < 0) {
                        uVar5 = 0;
                      }
                      else if (6 < (int)uVar5) {
                        uVar5 = 7;
                      }
                    }
                    if (uVar5 == 0) {
                      nomul(0,(char *)0x0);
                      if ((trap->field_0x8 & 0x1f) == 0x14) {
                        pmVar16 = activate_statue_trap(trap,x,y,'\0');
                        if (pmVar16 == (monst *)0x0) {
                          return 1;
                        }
                        exercise(2,'\x01');
                        return 1;
                      }
                      find_trap(trap);
                    }
                  }
                  goto LAB_00162a49;
                }
                if (pmVar16->m_ap_type == '\0') {
                  if (pmVar16->wormno == '\0') {
                    if (((viz_array[pmVar16->my][pmVar16->mx] & 2U) != 0) ||
                       (((((u.uprops[0x1e].intrinsic == 0 &&
                           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                          ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                         ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                          (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                        (((viz_array[pmVar16->my][pmVar16->mx] & 1U) != 0 &&
                         ((pmVar16->data->mflags3 & 0x200) != 0)))))) goto LAB_00163210;
                  }
                  else {
                    bVar3 = worm_known(level,pmVar16);
                    if (bVar3 != '\0') {
LAB_00163210:
                      uVar6 = *(uint *)&pmVar16->field_0x60;
                      if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                         (u.uprops[0xc].extrinsic != 0)) {
                        if ((uVar6 & 0x280) == 0) goto LAB_00163255;
                      }
                      else if (((uVar6 & 0x280) == 0) &&
                              (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_00163255:
                        if ((u._1052_1_ & 0x20) == 0) goto LAB_001633b8;
                      }
                    }
                  }
                  if (((((pmVar16->data->mflags1 & 0x10000) == 0) &&
                       ((poVar10 = which_armor(pmVar16,4), poVar10 == (obj *)0x0 ||
                        (poVar10 = which_armor(pmVar16,4), poVar10->otyp != 0x4f)))) &&
                      ((((u.uprops[0x1e].intrinsic != 0 ||
                         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                          (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                        (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                         ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                           youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
                       (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
                        (iVar4 = dist2((int)pmVar16->mx,(int)pmVar16->my,(int)u.ux,(int)u.uy),
                        iVar4 < 0x41)))))) ||
                     (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
                      (bVar3 = match_warn_of_mon(pmVar16), bVar3 != '\0')))) goto LAB_001633b8;
                  if (((char)*(uint *)&pmVar16->field_0x60 < '\0') &&
                     (((pmVar16->data->mflags1 & 0x100) != 0 || (pmVar16->data->mlet == '9')))) {
                    *(uint *)&pmVar16->field_0x60 = *(uint *)&pmVar16->field_0x60 & 0xffffff7f;
                  }
                  newsym(local_78,iVar15);
                }
                else {
                  seemimic(pmVar16);
                }
                exercise(2,'\x01');
                if (pmVar16->wormno == '\0') {
                  if (((viz_array[pmVar16->my][pmVar16->mx] & 2U) != 0) ||
                     (((((u.uprops[0x1e].intrinsic == 0 &&
                         ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                        (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                      (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                        (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                       (((viz_array[pmVar16->my][pmVar16->mx] & 1U) != 0 &&
                        ((pmVar16->data->mflags3 & 0x200) != 0)))))))) goto LAB_00162fd3;
                }
                else {
                  bVar3 = worm_known(level,pmVar16);
                  if (bVar3 != '\0') {
LAB_00162fd3:
                    uVar6 = *(uint *)&pmVar16->field_0x60;
                    if ((((uVar6 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                       (u.uprops[0xc].extrinsic != 0)) {
                      if ((uVar6 & 0x280) == 0) {
LAB_00163018:
                        if ((u._1052_1_ & 0x20) == 0) goto LAB_00163598;
                      }
                    }
                    else if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)
                            ) goto LAB_00163018;
                  }
                }
                if (((((pmVar16->data->mflags1 & 0x10000) == 0) &&
                     ((poVar10 = which_armor(pmVar16,4), poVar10 == (obj *)0x0 ||
                      (poVar10 = which_armor(pmVar16,4), poVar10->otyp != 0x4f)))) &&
                    ((((u.uprops[0x1e].intrinsic != 0 ||
                       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                        (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                      (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                       ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                         youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
                     (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
                      (iVar15 = dist2((int)pmVar16->mx,(int)pmVar16->my,(int)u.ux,(int)u.uy),
                      iVar15 < 0x41)))))) ||
                   (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
                    (bVar3 = match_warn_of_mon(pmVar16), bVar3 != '\0')))) {
LAB_00163598:
                  if (((pmVar16->data->mflags1 & 0x10000) == 0) &&
                     ((poVar10 = which_armor(pmVar16,4), poVar10 == (obj *)0x0 ||
                      (poVar10 = which_armor(pmVar16,4), poVar10->otyp != 0x4f)))) {
                    if (((u.uprops[0x1e].intrinsic != 0) ||
                        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
                       ((((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
                         (((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                          (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                          youmonst.data == mons + 0x32)) && (u.uprops[0x19].blocked == 0)))) {
                      return 1;
                    }
                    if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
                       (iVar8 = dist2((int)pmVar16->mx,(int)pmVar16->my,(int)u.ux,(int)u.uy),
                       iVar8 < 0x41)) {
                      return 1;
                    }
                  }
                  if (u.uprops[0x42].intrinsic != 0) {
                    return 1;
                  }
                  if (u.uprops[0x42].extrinsic != 0) {
                    return 1;
                  }
                  bVar3 = match_warn_of_mon(pmVar16);
                  if (bVar3 != '\0') {
                    return 1;
                  }
                  pcVar14 = a_monnam(pmVar16);
                  pline("You find %s.",pcVar14);
                  return 1;
                }
                if ((level->locations[local_68][uVar5].field_0x6 & 8) == 0) {
                  pline("You feel an unseen monster!");
                  map_invisible(x,y);
                  return 1;
                }
                goto LAB_00162a49;
              }
              uVar6 = mt_random();
              uVar6 = uVar6 % uVar11;
              lVar12 = (long)u.uluck;
              lVar9 = (long)u.moreluck;
              if (((int)(lVar9 + lVar12) != 0) &&
                 (uVar7 = mt_random(),
                 SUB168(ZEXT416(uVar7) % SEXT816(0x32 - (lVar9 + lVar12)),0) != 0)) {
                if ((local_70 < -8) || ((int)u.moreluck + (int)u.uluck < -5)) {
                  iVar4 = (int)u.moreluck + (int)u.uluck;
                }
                else {
                  iVar4 = ((int)u.moreluck + (int)u.uluck) / 3;
                }
                uVar6 = uVar6 - iVar4;
                if ((int)uVar6 < 0) {
                  uVar6 = 0;
                }
                else if ((int)uVar11 <= (int)uVar6) {
                  uVar6 = 6U - iVar8;
                }
              }
              plVar2 = level;
              if (uVar6 != 0) goto LAB_00162a49;
              uVar6 = *(uint *)&level->locations[local_68][uVar5].field_0x6;
              bVar3 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
              plVar2->locations[local_68][uVar5].typ = '\x17';
              uVar6 = (uVar6 & 0x180 | uVar6 >> 1 & 0x40) ^ 0x40;
              if (bVar3 != '\0') {
                uVar6 = 0;
              }
              *(uint *)&plVar2->locations[local_68][uVar5].field_0x6 =
                   *(uint *)&plVar2->locations[local_68][uVar5].field_0x6 & 0xfffffe0f | uVar6;
              exercise(2,'\x01');
              nomul(0,(char *)0x0);
              if ((u.uprops[0x1e].intrinsic == 0) &&
                 (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)))) {
LAB_00162e8a:
                newsym(local_78,iVar15);
              }
              else {
                if (ublindf != (obj *)0x0) {
                  if ((aflag == 0) && (ublindf->oartifact != '\x1d')) goto LAB_00162e97;
                  goto LAB_00162e8a;
                }
                if (aflag != 0) goto LAB_00162e8a;
LAB_00162e97:
                feel_location(x,y);
              }
              if (flags.verbose != '\0') {
                pcVar14 = "You find a secret door.";
LAB_00162ebd:
                pline(pcVar14);
              }
            }
LAB_00162a49:
            iVar15 = (int)(char)iVar13;
            iVar4 = (int)u.uy;
            iVar13 = iVar15 + 1;
          } while (iVar15 < iVar4 + 2);
        }
        local_68 = (ulong)(byte)(x + 1U);
        local_78 = (int)(char)(x + 1U);
      } while (local_78 < u.ux + 2);
    }
  }
  else if (aflag == 0) {
    pline("What are you looking for?  The exit?");
  }
  return 1;
}

Assistant:

int dosearch0(int aflag)
{
	xchar x, y;
	struct trap *trap;
	struct monst *mtmp;

	if (u.uswallow) {
		if (!aflag)
			pline("What are you looking for?  The exit?");
	} else {
	    int fund = (uwep && uwep->oartifact &&
		    spec_ability(uwep, SPFX_SEARCH)) ?
		    uwep->spe : 0;
	    if (ublindf && ublindf->otyp == LENSES && !Blind)
		    fund += 2; /* JDS: lenses help searching */
	    if (fund > 5) fund = 5;
	    for (x = u.ux-1; x < u.ux+2; x++)
	      for (y = u.uy-1; y < u.uy+2; y++) {
		if (!isok(x,y)) continue;
		if (x != u.ux || y != u.uy) {
		    if (Blind && !aflag) feel_location(x,y);
		    if (level->locations[x][y].typ == SDOOR) {
			if (rnl(7-fund)) continue;
			cvt_sdoor_to_door(&level->locations[x][y], &u.uz); /* .typ = DOOR */
			exercise(A_WIS, TRUE);
			nomul(0, NULL);
			if (Blind && !aflag)
			    feel_location(x,y);	/* make sure it shows up */
			else
			    newsym(x,y);
			if (flags.verbose) pline("You find a secret door.");
		    } else if (level->locations[x][y].typ == SCORR) {
			if (rnl(7-fund)) continue;
			level->locations[x][y].typ = CORR;
			unblock_point(x,y);	/* vision */
			exercise(A_WIS, TRUE);
			nomul(0, NULL);
			newsym(x,y);
			if (flags.verbose) pline("You find a secret passage.");
		    } else {
		/* Be careful not to find anything in an SCORR or SDOOR */
			if ((mtmp = m_at(level, x, y)) && !aflag) {
			    if (mtmp->m_ap_type) {
				seemimic(mtmp);
		find:		exercise(A_WIS, TRUE);
				if (!canspotmon(level, mtmp)) {
				    if (level->locations[x][y].mem_invis) {
					/* found invisible monster in a square
					 * which already has an 'I' in it.
					 * Logically, this should still take
					 * time and lead to a return(1), but if
					 * we did that the player would keep
					 * finding the same monster every turn.
					 */
					continue;
				    } else {
					pline("You feel an unseen monster!");
					map_invisible(x, y);
				    }
				} else if (!sensemon(mtmp))
				    pline("You find %s.", a_monnam(mtmp));
				return 1;
			    }
			    if (!canspotmon(level, mtmp)) {
				if (mtmp->mundetected &&
				   (is_hider(mtmp->data) || mtmp->data->mlet == S_EEL))
					mtmp->mundetected = 0;
				newsym(x,y);
				goto find;
			    }
			}

			/* see if an invisible monster has moved--if Blind,
			 * feel_location() already did it
			 */
			if (!aflag && !mtmp && !Blind &&
				    level->locations[x][y].mem_invis) {
			    unmap_object(x,y);
			    newsym(x,y);
			}

			if ((trap = t_at(level, x,y)) && !trap->tseen && !rnl(8)) {
			    nomul(0, NULL);

			    if (trap->ttyp == STATUE_TRAP) {
				if (activate_statue_trap(trap, x, y, FALSE))
				    exercise(A_WIS, TRUE);
				return 1;
			    } else {
				find_trap(trap);
			    }
			}
		    }
		}
	    }
	}
	return 1;
}